

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O1

void __thiscall
SAT::getLearntClause
          (SAT *this,int nodeid,set<int,_std::less<int>,_std::allocator<int>_> *contributingNogoods)

{
  vec<int> *this_00;
  double *pdVar1;
  ChannelInfo *pCVar2;
  Lit *pLVar3;
  char *pcVar4;
  Reason *pRVar5;
  Reason RVar6;
  Clause *pCVar7;
  char cVar8;
  uint uVar9;
  ostream *poVar10;
  bool *pbVar11;
  anon_union_8_2_743a5d44_for_Reason_0 aVar12;
  ulong uVar13;
  vec<Lit> *pvVar14;
  anon_union_8_2_743a5d44_for_Reason_0 aVar15;
  int iVar16;
  ulong uVar17;
  Lit n;
  uint uVar18;
  bool bVar19;
  Lit q;
  string local_90;
  int local_6c;
  Lit local_68;
  int local_64;
  vec<Lit> *local_60;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_58;
  Heap<SAT::VarOrderLt> *local_50;
  vec<int> *local_48;
  vec<int> *local_40;
  vec<Lit> *local_38;
  undefined4 extraout_var;
  
  n.x = ::lit_Undef.x;
  local_64 = nodeid;
  local_58 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             contributingNogoods;
  uVar9 = findConflictLevel(this);
  aVar12 = (anon_union_8_2_743a5d44_for_Reason_0)this->confl;
  pvVar14 = (this->trail).data + uVar9;
  local_60 = pvVar14;
  if (so.debug == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"trail of conflict level:",0x18);
    if (pvVar14->sz != 0) {
      uVar17 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        getLitString_abi_cxx11_(&local_90,pvVar14->data[uVar17].x);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p)
                   ,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
            &local_90.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p))
          ;
        }
        uVar17 = uVar17 + 1;
        pvVar14 = local_60;
      } while (uVar17 < local_60->sz);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  this->index = pvVar14->sz;
  local_38 = &this->out_learnt;
  if ((this->out_learnt).data != (Lit *)0x0) {
    local_38->sz = 0;
  }
  this_00 = &this->out_learnt_level;
  if ((this->out_learnt_level).data != (int *)0x0) {
    this_00->sz = 0;
  }
  vec<Lit>::push(local_38);
  local_40 = this_00;
  vec<int>::push(this_00);
  local_50 = &this->order_heap;
  local_48 = &this->ivseen_toclear;
  aVar15._pt = (Clause *)0x0;
  local_6c = 0;
  do {
    if ((*(uint *)aVar12._pt & 1) != 0) {
      uVar9 = *(uint *)aVar12._pt >> 8;
      (aVar12._pt)->data[uVar9].x = (int)((float)this->cla_inc + (float)(aVar12._pt)->data[uVar9].x)
      ;
      aVar12._pt[1].data[(ulong)uVar9 - 1].x = aVar12._pt[1].data[(ulong)uVar9 - 1].x + 1;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_58,&aVar12._pt[1].data[uVar9].x);
    }
    if (so.print_implications == true) {
      cVar8 = std::__basic_file<char>::is_open();
      if (cVar8 == '\0') {
        std::ofstream::open(implication_stream,0x1dfc39);
      }
      std::ostream::operator<<((ostream *)implication_stream,local_64);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,",",1);
      if (n.x == ::lit_Undef.x) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,"false",5);
      }
      else {
        getLitString_abi_cxx11_(&local_90,n.x);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)implication_stream,
                   (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p)
                   ,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
            &local_90.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p))
          ;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,",",1);
      if ((uint)(n.x != ::lit_Undef.x) < *(uint *)aVar12._pt >> 8) {
        uVar17 = (ulong)(n.x != ::lit_Undef.x);
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream," ",1);
          if (*(uint *)aVar12._pt >> 8 <= uVar17) goto LAB_001c5464;
          getLitString_abi_cxx11_(&local_90,(aVar12._pt)->data[uVar17].x ^ 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)implication_stream,
                     (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                      (uint)local_90._M_dataplus._M_p),local_90._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
              &local_90.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p
                                    ));
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < *(uint *)aVar12._pt >> 8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)implication_stream,"\n",1);
    }
    if (so.debug == true) {
      if (((ulong)*aVar12._pt & 1) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"L",1);
        poVar10 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cerr,
                             ((Lit *)(aVar12._a + 0xc))[*(uint *)aVar12._pt >> 8].x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
      if (n.x == ::lit_Undef.x) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"false",5);
      }
      else {
        getLitString_abi_cxx11_(&local_90,n.x);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p)
                   ,local_90._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
            &local_90.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p))
          ;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  <-",4);
      if ((uint)(n.x != ::lit_Undef.x) < *(uint *)aVar12._pt >> 8) {
        uVar17 = (ulong)(n.x != ::lit_Undef.x);
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  \t",3);
          if (*(uint *)aVar12._pt >> 8 <= uVar17) goto LAB_001c5464;
          getLitString_abi_cxx11_(&local_90,(aVar12._pt)->data[uVar17].x ^ 1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                      (uint)local_90._M_dataplus._M_p),local_90._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
              &local_90.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p
                                    ));
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < *(uint *)aVar12._pt >> 8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    }
    iVar16 = local_6c;
    if ((uint)(n.x != ::lit_Undef.x) < *(uint *)aVar12._pt >> 8) {
      uVar17 = (ulong)(n.x != ::lit_Undef.x);
      do {
        if (*(uint *)aVar12._pt >> 8 <= uVar17) goto LAB_001c5464;
        uVar9 = (aVar12._pt)->data[uVar17].x;
        uVar18 = (int)uVar9 >> 1;
        local_68.x = uVar9;
        if ((this->seen).data[uVar18] == '\0') {
          if (so.vsids == true) {
            pdVar1 = (this->activity).data;
            pdVar1[uVar18] = this->var_inc + pdVar1[uVar18];
            if (((int)uVar18 < (int)(this->order_heap).indices.sz) &&
               (-1 < (this->order_heap).indices.data[uVar18])) {
              Heap<SAT::VarOrderLt>::decrease(local_50,uVar18);
            }
            if (so.sat_polarity == 2) {
              pbVar11 = (this->polarity).data;
            }
            else {
              if (so.sat_polarity != 1) goto LAB_001c5020;
              pbVar11 = (this->polarity).data;
              uVar9 = (uint)(byte)~(byte)uVar9;
            }
            pbVar11[uVar18] = (bool)((byte)uVar9 & 1);
          }
LAB_001c5020:
          pCVar2 = (this->c_info).data;
          if (((ulong)pCVar2[uVar18] & 0x60000000) == 0x20000000) {
            local_90._M_dataplus._M_p._0_4_ = *(uint *)(pCVar2 + uVar18) & 0x1fffffff;
            pbVar11 = (this->ivseen).data;
            if (pbVar11[(uint)local_90._M_dataplus._M_p] == false) {
              engine.vars.data[(uint)local_90._M_dataplus._M_p]->activity =
                   this->var_inc + engine.vars.data[(uint)local_90._M_dataplus._M_p]->activity;
              pbVar11[(uint)local_90._M_dataplus._M_p] = true;
              vec<int>::push(local_48,(int *)&local_90);
            }
          }
          (this->seen).data[uVar18] = '\x01';
          if ((this->trailpos).data[uVar18] < engine.trail_lim.data[engine.trail_lim.sz - 1]) {
            if (so.debug == true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"added ",6);
              getLitString_abi_cxx11_(&local_90,local_68.x ^ 1);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                    (uint)local_90._M_dataplus._M_p),
                                   local_90._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," to nogood\n",0xb);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
                  &local_90.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                         (uint)local_90._M_dataplus._M_p));
              }
            }
            vec<Lit>::push(local_38,&local_68);
            uVar13 = (ulong)engine.trail_lim.sz;
            iVar16 = engine.trail_lim.sz + 1;
            do {
              bVar19 = uVar13 == 0;
              uVar13 = uVar13 - 1;
              if (bVar19) {
                iVar16 = 0;
                break;
              }
              iVar16 = iVar16 + -1;
            } while ((this->trailpos).data[uVar18] < engine.trail_lim.data[uVar13]);
            local_90._M_dataplus._M_p._0_4_ = iVar16 - 1;
            if (iVar16 == 0) {
              local_90._M_dataplus._M_p._0_4_ = 0;
            }
            vec<int>::push(local_40,(int *)&local_90);
          }
          else {
            local_6c = local_6c + 1;
            if (so.debug == true) {
              getLitString_abi_cxx11_(&local_90,local_68.x ^ 1);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,
                                   (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                    (uint)local_90._M_dataplus._M_p),
                                   local_90._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," is from current level; incremented pathC to ",0x2d);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,local_6c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
              goto LAB_001c51e3;
            }
          }
        }
        else if (so.debug == true) {
          getLitString_abi_cxx11_(&local_90,uVar9 ^ 1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,
                               (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                (uint)local_90._M_dataplus._M_p),
                               local_90._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," already marked as seen; skipping explanation\n",0x2e);
LAB_001c51e3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
              &local_90.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p
                                    ));
          }
        }
        uVar17 = uVar17 + 1;
        iVar16 = local_6c;
      } while (uVar17 < *(uint *)aVar12._pt >> 8);
    }
    while( true ) {
      pLVar3 = local_60->data;
      pcVar4 = (this->seen).data;
      uVar9 = this->index;
      do {
        uVar9 = uVar9 - 1;
        this->index = uVar9;
        n.x = pLVar3[uVar9].x;
        uVar18 = n.x >> 1;
      } while (pcVar4[uVar18] == '\0');
      pcVar4[uVar18] = '\0';
      if (so.debug == true) {
        local_6c = iVar16;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"selected ",9);
        getLitString_abi_cxx11_(&local_90,n.x);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             (char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                              (uint)local_90._M_dataplus._M_p),
                             local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," as next literal to explain away\n",0x21);
        iVar16 = local_6c;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p) !=
            &local_90.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)local_90._M_dataplus._M_p))
          ;
          iVar16 = local_6c;
        }
      }
      iVar16 = iVar16 + -1;
      if ((iVar16 == 0) && (((uint)(this->flags).data[uVar18] & 2) != 0)) {
        local_6c = iVar16;
        if (so.debug == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"one only literal left at current level; finished\n",0x31
                    );
        }
        bVar19 = false;
        goto LAB_001c5425;
      }
      pRVar5 = (this->reason).data;
      if (aVar15._pt != pRVar5[uVar18].field_0._pt) break;
      if (so.debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"same reason as previously explained literal; skipping\n",
                   0x36);
      }
    }
    aVar15 = (anon_union_8_2_743a5d44_for_Reason_0)pRVar5[uVar18].field_0._pt;
    pRVar5 = (this->reason).data;
    aVar12 = (anon_union_8_2_743a5d44_for_Reason_0)pRVar5[uVar18].field_0._pt;
    bVar19 = true;
    uVar9 = aVar12._0_4_ & 3;
    local_6c = iVar16;
    if ((aVar12._a & 3) != 0) {
      if (uVar9 == 1) {
        btToPos(this,this->index,(this->trailpos).data[uVar18]);
        RVar6.field_0 = (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[uVar18].field_0._a
        ;
        aVar12._0_4_ = (*engine.propagators.data[(ulong)RVar6.field_0 >> 0x20]->_vptr_Propagator[5])
                                 (engine.propagators.data[(ulong)RVar6.field_0 >> 0x20],
                                  (ulong)(uint)n.x,(ulong)RVar6.field_0 >> 2 & 0x3fffffff);
        aVar12._a._4_4_ = extraout_var;
      }
      else {
        pCVar7 = this->short_expl;
        *(uint *)pCVar7 = uVar9 << 8 | (uint)*(byte *)pCVar7;
        if (((ulong)aVar12 & 3) == 0 || uVar9 == 1) {
LAB_001c5464:
          abort();
        }
        *(uint *)(pCVar7 + 1) = *(uint *)&pRVar5[uVar18].field_0 >> 2;
        if (uVar9 == 3) {
          pCVar7[1].data[0].x = *(int *)((long)&pRVar5[uVar18].field_0 + 4);
        }
        aVar12 = (anon_union_8_2_743a5d44_for_Reason_0)this->short_expl;
      }
    }
LAB_001c5425:
    if (!bVar19) {
      ((this->out_learnt).data)->x = n.x ^ 1;
      *(this->out_learnt_level).data = (this->trail).sz - 2;
      return;
    }
  } while( true );
}

Assistant:

void SAT::getLearntClause(int nodeid, std::set<int>& contributingNogoods) {
	Lit p = lit_Undef;
	int pathC = 0;
	const int clevel = findConflictLevel();
	vec<Lit>& ctrail = trail[clevel];
	Clause* expl = confl;
	Reason last_reason = nullptr;

	if (so.debug) {
		std::cerr << "trail of conflict level:";
		for (unsigned int i = 0; i < ctrail.size(); i++) {
			std::cerr << " ";
			std::cerr << getLitString(toInt(ctrail[i]));
		}
		std::cerr << "\n";
	}

	index = ctrail.size();
	out_learnt.clear();
	out_learnt_level.clear();
	out_learnt.push();  // (leave room for the asserting literal)
	out_learnt_level.push();

	while (true) {
		assert(expl != nullptr);  // (otherwise should be UIP)
		Clause& c = *expl;

		if (PRINT_ANALYSIS) {
			if (p != lit_Undef) {
				c[0] = p;
			}
			printClause(c);
		}

		if (c.learnt) {
			c.activity() += static_cast<float>(cla_inc);
			c.rawActivity() += 1;
			contributingNogoods.insert(c.clauseID());
		}

		/* if (so.debug) { */
		/*   if (p == lit_Undef) { */
		/*     std::cerr << "explaining away failure (" << decisionLevel() << ")\n"; */
		/*   } else { */
		/*     std::cerr << "explaining away " << getLitString(toInt(p)) << " (lit number " << toInt(p)
		 * << ", level " << getLevel(var(p)) << ")\n"; */
		/*   } */
		/*   std::cerr << "expl:"; */
		/*   for (int i = (p == lit_Undef ? 0 : 1) ; i < c.size() ; i++) */
		/*     std::cerr << " " << getLitString(toInt(~c[i])); */
		/*   std::cerr << "\n"; */
		/* } */

		if (so.print_implications) {
			if (!implication_stream.is_open()) {
				implication_stream.open("implication-log.csv");
			}

			implication_stream << nodeid;
			implication_stream << ",";
			if (p == lit_Undef) {
				implication_stream << "false";
			} else {
				implication_stream << getLitString(toInt(p));
			}
			implication_stream << ",";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				implication_stream << " " << getLitString(toInt(~c[i]));
			}
			implication_stream << "\n";
		}

		if (so.debug) {
			if (c.learnt) {
				std::cerr << "L" << c.clauseID() << " ";
			}
			std::cerr << "\t";

			if (p == lit_Undef) {
				std::cerr << "false";
			} else {
				std::cerr << getLitString(toInt(p));
			}
			std::cerr << "  <-";
			for (unsigned int i = (p == lit_Undef ? 0 : 1); i < c.size(); i++) {
				std::cerr << "  \t" << getLitString(toInt(~c[i]));
			}
			std::cerr << "\n";
		}

		for (unsigned int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++) {
			const Lit q = c[j];
			const int x = var(q);
			/* if (so.debug) { */
			/*   std::cerr << "adding " << getLitString(toInt(~q)) << " (lit number " << toInt(~q) << ",
			 * var " << x << ") from level " << getLevel(x); */
			/* } */
			if (seen[x] == 0) {
				varBumpActivity(q);
				seen[x] = 1;
				if (isCurLevel(x)) {
					pathC++;
					if (so.debug) {
						std::cerr << getLitString(toInt(~q)) << " is from current level; incremented pathC to "
											<< pathC << "\n";
					}
				} else {
					if (so.debug) {
						std::cerr << "added " << getLitString(toInt(~q)) << " to nogood\n";
					}
					out_learnt.push(q);
					out_learnt_level.push(getLevel(x));
				}
			} else {
				if (so.debug) {
					//                            std::cerr << " but already seen this variable";
					std::cerr << getLitString(toInt(~q)) << " already marked as seen; skipping explanation\n";
				}
			}
			/* if (so.debug) { */
			/*   std::cerr << ", pathC is now " << pathC << "\n"; */
			/* } */
		}

	FindNextExpl:

		assert(pathC > 0);

		// Select next clause to look at:
		while (seen[var(ctrail[--index])] == 0) {
			;
		}
		assert(index >= 0);
		p = ctrail[index];
		seen[var(p)] = 0;
		pathC--;

		if (so.debug) {
			std::cerr << "selected " << getLitString(toInt(p)) << " as next literal to explain away\n";
		}

		if (pathC == 0 && flags[var(p)].uipable()) {
			if (so.debug) {
				std::cerr << "one only literal left at current level; finished\n";
			}
			break;
		}

		// This appears to be just an optimisation.
		if (last_reason == reason[var(p)]) {
			if (so.debug) {
				std::cerr << "same reason as previously explained literal; skipping\n";
			}
			goto FindNextExpl;
		}
		last_reason = reason[var(p)];
		expl = getExpl(p);
	}

	out_learnt[0] = ~p;
	out_learnt_level[0] = decisionLevel() - 1;
}